

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

int queue_segment_start(mixed_segment *segment)

{
  void *pvVar1;
  byte bVar2;
  
  pvVar1 = segment->data;
  if (*(uint *)((long)pvVar1 + 0x18) != 0) {
    bVar2 = 0;
    do {
      if (*(long *)(*(long *)((long)pvVar1 + 0x10) + (ulong)bVar2 * 8) == 0) goto LAB_001430db;
      bVar2 = bVar2 + 1;
    } while ((uint)bVar2 < *(uint *)((long)pvVar1 + 0x18));
  }
  if (*(uint *)((long)pvVar1 + 0x28) != 0) {
    bVar2 = 0;
    do {
      if (*(long *)(*(long *)((long)pvVar1 + 0x20) + (ulong)bVar2 * 8) == 0) {
LAB_001430db:
        mixed_err(0x16);
        return 0;
      }
      bVar2 = bVar2 + 1;
    } while ((uint)bVar2 < *(uint *)((long)pvVar1 + 0x28));
  }
  return 1;
}

Assistant:

int queue_segment_start(struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  for(mixed_channel_t i=0; i<data->out_count; ++i){
    if(data->out[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  for(mixed_channel_t i=0; i<data->in_count; ++i){
    if(data->in[i] == 0){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}